

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<-17>,_boost::random::detail::M3<-28>,_boost::random::detail::M3<-1>,_boost::random::detail::no_tempering>,_134732491U>
     ::run(void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_d68;
  basic_cstring<const_char> local_d58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d48;
  assertion_result local_d28;
  basic_cstring<const_char> local_d10;
  basic_cstring<const_char> local_d00;
  basic_cstring<const_char> local_cf0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ce0;
  basic_cstring<const_char> local_cb8;
  basic_cstring<const_char> local_ca8;
  undefined4 local_c98;
  result_type local_c94;
  basic_cstring<const_char> local_c90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c80;
  basic_cstring<const_char> local_c58;
  basic_cstring<const_char> local_c48;
  undefined4 local_c38;
  result_type local_c34;
  basic_cstring<const_char> local_c30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c20;
  basic_cstring<const_char> local_bf8;
  basic_cstring<const_char> local_be8;
  undefined4 local_bd4;
  result_type local_bd0 [4];
  basic_cstring<const_char> local_bc0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_bb0;
  basic_cstring<const_char> local_b88;
  basic_cstring<const_char> local_b78;
  undefined1 local_b68 [8];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<_17>,_boost::random::detail::M3<_28>,_boost::random::detail::M3<_1>,_boost::random::detail::no_tempering>,_134732491U>
  c;
  
  WellTestCase((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<_17>,_boost::random::detail::M3<_28>,_boost::random::detail::M3<_1>,_boost::random::detail::no_tempering>,_134732491U>
                *)local_b68);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b88);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b78,0x43,&local_b88);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_bb0,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_bd0[0] = generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<_17>,_boost::random::detail::M3<_28>,_boost::random::detail::M3<_1>,_boost::random::detail::no_tempering>,_134732491U>
                             *)local_b68);
    local_bd4 = 0x807dacb;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_bb0,&local_bc0,0x43,1,2,local_bd0,"c.generate()",&local_bd4,"Expected");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_bb0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_be8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bf8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_be8,0x44,&local_bf8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c20,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_c34 = boost::random::
                well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<-17>,_boost::random::detail::M3<-28>,_boost::random::detail::M3<-1>,_boost::random::detail::no_tempering>
                ::min();
    local_c38 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_c20,&local_c30,0x44,1,2,&local_c34,"c.rng.min()",&local_c38,"0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c48,0x45,&local_c58);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c80,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_c94 = boost::random::
                well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<-17>,_boost::random::detail::M3<-28>,_boost::random::detail::M3<-1>,_boost::random::detail::no_tempering>
                ::max();
    local_c98 = 0xffffffff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_c80,&local_c90,0x45,1,2,&local_c94,"c.rng.max()",&local_c98,"~0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cb8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ca8,0x46,&local_cb8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ce0,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cf0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::random::well_engine<unsigned_int,32ul,726ul,23ul,667ul,43ul,462ul,boost::random::detail::M3<28>,boost::random::detail::M1,boost::random::detail::M3<18>,boost::random::detail::M3<3>,boost::random::detail::M3<21>,boost::random::detail::M3<_17>,boost::random::detail::M3<_28>,boost::random::detail::M3<_1>,boost::random::detail::no_tempering>,boost::random::well_engine<unsigned_int,32ul,726ul,23ul,667ul,43ul,462ul,boost::random::detail::M3<28>,boost::random::detail::M1,boost::random::detail::M3<18>,boost::random::detail::M3<3>,boost::random::detail::M3<21>,boost::random::detail::M3<_17>,boost::random::detail::M3<_28>,boost::random::detail::M3<_1>,boost::random::detail::no_tempering>>
              (&local_ce0,&local_cf0,0x46,1,2,local_b68,"c.rng",local_b68,"c.rng");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ce0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d00,0x47,&local_d10);
    bVar2 = boost::random::operator==
                      ((well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<_17>,_boost::random::detail::M3<_28>,_boost::random::detail::M3<_1>,_boost::random::detail::no_tempering>
                        *)local_b68,
                       (well_engine<unsigned_int,_32UL,_726UL,_23UL,_667UL,_43UL,_462UL,_boost::random::detail::M3<28>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M3<3>,_boost::random::detail::M3<21>,_boost::random::detail::M3<_17>,_boost::random::detail::M3<_28>,_boost::random::detail::M3<_1>,_boost::random::detail::no_tempering>
                        *)local_b68);
    boost::test_tools::assertion_result::assertion_result(&local_d28,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d58,"c.rng == c.rng",0xe);
    boost::unit_test::operator<<(&local_d48,plVar3,&local_d58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion(&local_d28,&local_d48,&local_d68,0x47,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d48);
    boost::test_tools::assertion_result::~assertion_result(&local_d28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

static void run()
    {
        WellTestCase c;

        BOOST_CHECK_EQUAL(c.generate(), Expected);
        BOOST_CHECK_EQUAL(c.rng.min(), 0U);
        BOOST_CHECK_EQUAL(c.rng.max(), ~0U);
        BOOST_CHECK_EQUAL(c.rng, c.rng);
        BOOST_CHECK(c.rng == c.rng);
    }